

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

archive_string * archive_strncat(archive_string *as,void *_p,size_t n)

{
  archive_string *paVar1;
  size_t sVar2;
  size_t s;
  
  if (n == 0) {
    s = 0;
  }
  else {
    sVar2 = 0;
    do {
      s = sVar2;
      if (*(char *)((long)_p + sVar2) == '\0') break;
      sVar2 = sVar2 + 1;
      s = n;
    } while (n != sVar2);
  }
  paVar1 = archive_string_append(as,(char *)_p,s);
  if (paVar1 == (archive_string *)0x0) {
    __archive_errx(1,"Out of memory");
  }
  return paVar1;
}

Assistant:

struct archive_string *
archive_strncat(struct archive_string *as, const void *_p, size_t n)
{
	size_t s;
	const char *p, *pp;

	p = (const char *)_p;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	while (s < n && *pp) {
		pp++;
		s++;
	}
	if ((as = archive_string_append(as, p, s)) == NULL)
		__archive_errx(1, "Out of memory");
	return (as);
}